

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void EMIT_OP_RPTR_REG(CodeGenGenericContext *ctx,x86Command op,x86Size size,x86Reg index,
                     int multiplier,x86Reg base,uint shift,x86Reg reg2)

{
  x86Argument arg_00;
  x86Argument arg_01;
  CodeGenGenericContext *pCVar1;
  x86Argument local_c8;
  undefined1 local_a8 [16];
  anon_union_8_6_73be8994_for_x86Argument_2 local_98;
  x86Reg local_90;
  x86Reg xStack_8c;
  x86Argument local_88;
  undefined1 local_68 [16];
  anon_union_8_6_73be8994_for_x86Argument_2 local_58;
  x86Reg local_50;
  x86Reg xStack_4c;
  undefined1 local_48 [8];
  x86Argument arg;
  x86Reg redirect;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Size size_local;
  x86Command op_local;
  CodeGenGenericContext *ctx_local;
  
  arg.ptrNum = base;
  redirect = multiplier;
  base_local = index;
  multiplier_local = size;
  index_local = op;
  _size_local = ctx;
  CodeGenGenericContext::RedirectAddressComputation
            (ctx,&base_local,(int *)&redirect,(x86Reg *)&arg.ptrNum,&shift);
  reg2 = CodeGenGenericContext::RedirectRegister(_size_local,reg2);
  arg.ptrMult = reg2;
  if ((multiplier_local == 3) && (_size_local->genReg[reg2].type == argNumber)) {
    EMIT_OP_RPTR_NUM(_size_local,index_local,sDWORD,base_local,redirect,arg.ptrNum,shift,
                     _size_local->genReg[reg2].field_1.labelID);
  }
  else {
    CodeGenGenericContext::ReadRegister(_size_local,arg.ptrNum);
    CodeGenGenericContext::ReadRegister(_size_local,base_local);
    CodeGenGenericContext::ReadRegister(_size_local,reg2);
    x86Argument::x86Argument
              ((x86Argument *)local_48,multiplier_local,base_local,redirect,arg.ptrNum,shift);
    switch(index_local) {
    case rEAX:
    case 0x4d:
      if (arg.ptrNum == 5) {
        __assert_fail("base != rESP",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                      ,0x6ff,
                      "void EMIT_OP_RPTR_REG(CodeGenGenericContext &, x86Command, x86Size, x86Reg, int, x86Reg, unsigned int, x86Reg)"
                     );
      }
      local_68._0_8_ = local_48;
      local_68._8_8_ = arg._0_8_;
      local_58 = arg.field_1;
      local_50 = arg.ptrBase;
      xStack_4c = arg.ptrIndex;
      arg_00.field_1.reg = arg.type;
      arg_00._0_8_ = local_48;
      arg_00.field_1.imm64Arg._4_4_ = arg._4_4_;
      arg_00.ptrBase = arg.field_1._0_4_;
      arg_00.ptrIndex = arg.field_1._4_4_;
      arg_00.ptrMult = arg.ptrBase;
      arg_00.ptrNum = arg.ptrIndex;
      CodeGenGenericContext::InvalidateAddressValue(_size_local,arg_00);
      CodeGenGenericContext::MemKillDeadStore(_size_local,(x86Argument *)local_48);
      pCVar1 = _size_local;
      x86Argument::x86Argument(&local_88,reg2);
      CodeGenGenericContext::MemWrite(pCVar1,(x86Argument *)local_48,&local_88);
      break;
    default:
      __assert_fail("!\"unknown instruction\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                    ,0x71f,
                    "void EMIT_OP_RPTR_REG(CodeGenGenericContext &, x86Command, x86Size, x86Reg, int, x86Reg, unsigned int, x86Reg)"
                   );
    case rR15|rR12:
    case rR15|rR13:
    case rR15|rR14:
    case 0x20:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x4f:
    case 0x50:
    case 0x56:
    case 0x57:
    case 0x58:
      CodeGenGenericContext::MemRead(_size_local,(x86Argument *)local_48);
      local_a8._0_8_ = local_48;
      local_a8._8_8_ = arg._0_8_;
      local_98 = arg.field_1;
      local_90 = arg.ptrBase;
      xStack_8c = arg.ptrIndex;
      arg_01.field_1.reg = arg.type;
      arg_01._0_8_ = local_48;
      arg_01.field_1.imm64Arg._4_4_ = arg._4_4_;
      arg_01.ptrBase = arg.field_1._0_4_;
      arg_01.ptrIndex = arg.field_1._4_4_;
      arg_01.ptrMult = arg.ptrBase;
      arg_01.ptrNum = arg.ptrIndex;
      CodeGenGenericContext::InvalidateAddressValue(_size_local,arg_01);
      pCVar1 = _size_local;
      x86Argument::x86Argument(&local_c8);
      CodeGenGenericContext::MemWrite(pCVar1,(x86Argument *)local_48,&local_c8);
      break;
    case 0x2a:
    case 0x59:
      CodeGenGenericContext::MemRead(_size_local,(x86Argument *)local_48);
    }
    _size_local->x86Op->name = index_local;
    (_size_local->x86Op->argA).type = argPtr;
    (_size_local->x86Op->argA).field_1.num = multiplier_local;
    (_size_local->x86Op->argA).ptrIndex = base_local;
    (_size_local->x86Op->argA).ptrMult = redirect;
    (_size_local->x86Op->argA).ptrBase = arg.ptrNum;
    (_size_local->x86Op->argA).ptrNum = shift;
    (_size_local->x86Op->argB).type = argReg;
    (_size_local->x86Op->argB).field_1.reg = reg2;
    _size_local->x86Op = _size_local->x86Op + 1;
  }
  return;
}

Assistant:

void EMIT_OP_RPTR_REG(CodeGenGenericContext &ctx, x86Command op, x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift, x86Reg reg2)
{
#ifdef NULLC_OPTIMIZE_X86
	ctx.RedirectAddressComputation(index, multiplier, base, shift);

	x86Reg redirect = ctx.RedirectRegister(reg2);

	// On x86 it is impossible to move extra registers into a byte of memory, so some redirections are ignored
	if(sizeof(void*) == 4 && size == sBYTE)
	{
		if(redirect <= rEDX)
			reg2 = redirect;
	}
	else
	{
		reg2 = redirect;
	}

	if(size == sDWORD && ctx.genReg[reg2].type == x86Argument::argNumber)
	{
		EMIT_OP_RPTR_NUM(ctx, op, size, index, multiplier, base, shift, ctx.genReg[reg2].num);
		return;
	}

	// Register reads
	ctx.ReadRegister(base);
	ctx.ReadRegister(index);
	ctx.ReadRegister(reg2);

	x86Argument arg = x86Argument(size, index, multiplier, base, shift);

	switch(op)
	{
	case o_mov:
	case o_mov64:
		assert(base != rESP);

		ctx.InvalidateAddressValue(arg);

		ctx.MemKillDeadStore(arg);

		// Track target memory value
		ctx.MemWrite(arg, x86Argument(reg2));
		break;
	case o_add:
	case o_sub:
	case o_adc:
	case o_sbb:
	case o_and:
	case o_or:
	case o_xor:
	case o_add64:
	case o_sub64:
	case o_and64:
	case o_or64:
	case o_xor64:
		ctx.MemRead(arg);

		ctx.InvalidateAddressValue(arg);
		
		ctx.MemWrite(arg, x86Argument());
		break;
	case o_cmp:
	case o_cmp64:
		ctx.MemRead(arg);
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argPtr;
	ctx.x86Op->argA.ptrSize = size;
	ctx.x86Op->argA.ptrIndex = index;
	ctx.x86Op->argA.ptrMult = multiplier;
	ctx.x86Op->argA.ptrBase = base;
	ctx.x86Op->argA.ptrNum = shift;
	ctx.x86Op->argB.type = x86Argument::argReg;
	ctx.x86Op->argB.reg = reg2;
	ctx.x86Op++;
}